

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[6],pstack::Dwarf::Encoding,char>
          (JObject *this,char (*k) [6],Encoding *v,char *c)

{
  ostream *os;
  char (*local_40) [6];
  Field<char[6],_pstack::Dwarf::Encoding> field;
  
  local_40 = k;
  field.k = (char (*) [6])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (Encoding *)&local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[6],_pstack::Dwarf::Encoding>,_char> *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }